

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O3

void __thiscall HTTPRequest::~HTTPRequest(HTTPRequest *this)

{
  string_view source_file;
  bool bVar1;
  Logger *pLVar2;
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> reply;
  string_view str;
  string_view logging_function;
  string log_msg;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->replySent == false) {
    pLVar2 = LogInstance();
    bVar1 = BCLog::Logger::Enabled(pLVar2);
    if (bVar1) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      tinyformat::format<char[13]>
                (&local_70,"%s: Unhandled request\n",(char (*) [13])"~HTTPRequest");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pLVar2 = LogInstance();
      local_70._M_dataplus._M_p = (pointer)0x57;
      local_70._M_string_length = 0x8419c9;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/httpserver.cpp"
      ;
      source_file._M_len = 0x57;
      str._M_str = local_50._M_dataplus._M_p;
      str._M_len = local_50._M_string_length;
      logging_function._M_str = "~HTTPRequest";
      logging_function._M_len = 0xc;
      BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,0x253,ALL,Info);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    }
    reply._M_extent._M_extent_value = 0x11;
    reply._M_ptr = (pointer)"Unhandled request";
    WriteReply(this,500,reply);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

HTTPRequest::~HTTPRequest()
{
    if (!replySent) {
        // Keep track of whether reply was sent to avoid request leaks
        LogPrintf("%s: Unhandled request\n", __func__);
        WriteReply(HTTP_INTERNAL_SERVER_ERROR, "Unhandled request");
    }
    // evhttpd cleans up the request, as long as a reply was sent.
}